

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noop.cc
# Opt level: O0

base_learner * noop_setup(options_i *options,vw *param_2)

{
  undefined8 *in_RDI;
  option_group_definition new_options;
  bool noop;
  string *in_stack_fffffffffffffe48;
  typed_option<bool> *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  allocator local_179;
  string local_178 [16];
  typed_option<bool> *in_stack_fffffffffffffe98;
  option_group_definition *in_stack_fffffffffffffea0;
  allocator local_151;
  string local_150 [32];
  typed_option<bool> local_130;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [63];
  byte local_19;
  undefined8 *local_10;
  base_learner *local_8;
  
  local_19 = 0;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"Noop Learner",&local_79);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"noop",&local_151);
  VW::config::make_option<bool>(in_stack_fffffffffffffe58,(bool *)in_stack_fffffffffffffe50);
  VW::config::typed_option<bool>::keep(&local_130,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"do no learning",&local_179);
  VW::config::typed_option<bool>::help(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  (**(code **)*local_10)(local_10,local_58);
  if ((local_19 & 1) == 0) {
    local_8 = (base_learner *)0x0;
  }
  else {
    in_stack_fffffffffffffe50 =
         (typed_option<bool> *)
         LEARNER::init_learner<char,example,LEARNER::learner<char,char>>
                   ((_func_void_char_ptr_learner<char,_char>_ptr_example_ptr *)
                    in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
    local_8 = LEARNER::make_base<char,example>((learner<char,_example> *)in_stack_fffffffffffffe50);
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffe50);
  return local_8;
}

Assistant:

LEARNER::base_learner* noop_setup(options_i& options, vw&)
{
  bool noop = false;
  option_group_definition new_options("Noop Learner");
  new_options.add(make_option("noop", noop).keep().help("do no learning"));
  options.add_and_parse(new_options);

  if (!noop)
    return nullptr;

  return make_base(LEARNER::init_learner(learn, 1));
}